

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_compression.c
# Opt level: O0

int ptls_init_compressed_certificate
              (ptls_emit_compressed_certificate_t *self,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  ptls_iovec_t *ppVar1;
  size_t num_certificates_00;
  size_t certificates_00;
  ptls_iovec_t pVar2;
  code *local_78;
  undefined2 local_70;
  int local_34;
  size_t sStack_30;
  int ret;
  size_t num_certificates_local;
  ptls_iovec_t *certificates_local;
  ptls_emit_compressed_certificate_t *self_local;
  ptls_iovec_t ocsp_status_local;
  
  ocsp_status_local.base = (uint8_t *)ocsp_status.len;
  self_local = (ptls_emit_compressed_certificate_t *)ocsp_status.base;
  sStack_30 = num_certificates;
  num_certificates_local = (size_t)certificates;
  certificates_local = (ptls_iovec_t *)self;
  memset(&local_78,0,0x40);
  local_78 = emit_compressed_certificate;
  local_70 = 2;
  memcpy(self,&local_78,0x40);
  certificates_00 = num_certificates_local;
  num_certificates_00 = sStack_30;
  ppVar1 = certificates_local + 2;
  pVar2 = ptls_iovec_init((void *)0x0,0);
  local_34 = build_compressed((st_ptls_compressed_certificate_entry_t *)&ppVar1->len,
                              (ptls_iovec_t *)certificates_00,num_certificates_00,pVar2);
  if ((local_34 == 0) &&
     ((ocsp_status_local.base == (uint8_t *)0x0 ||
      (pVar2.len = (size_t)ocsp_status_local.base, pVar2.base = (uint8_t *)self_local,
      local_34 = build_compressed((st_ptls_compressed_certificate_entry_t *)(certificates_local + 1)
                                  ,(ptls_iovec_t *)num_certificates_local,sStack_30,pVar2),
      local_34 == 0)))) {
    local_34 = 0;
  }
  if (local_34 != 0) {
    ptls_dispose_compressed_certificate((ptls_emit_compressed_certificate_t *)certificates_local);
  }
  return local_34;
}

Assistant:

int ptls_init_compressed_certificate(ptls_emit_compressed_certificate_t *self, ptls_iovec_t *certificates, size_t num_certificates,
                                     ptls_iovec_t ocsp_status)
{
    int ret;

    *self = (ptls_emit_compressed_certificate_t){{emit_compressed_certificate}, PTLS_CERTIFICATE_COMPRESSION_ALGORITHM_BROTLI};

    /* build entries */
    if ((ret = build_compressed(&self->without_ocsp_status, certificates, num_certificates, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if (ocsp_status.len != 0) {
        if ((ret = build_compressed(&self->with_ocsp_status, certificates, num_certificates, ocsp_status)) != 0)
            goto Exit;
    }

    ret = 0;

Exit:
    if (ret != 0)
        ptls_dispose_compressed_certificate(self);
    return ret;
}